

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS
MakeJson5AndVerify(void *Structure,JlMarshallElement *StructDescription,
                  uint32_t StructDescriptionCount,char *ExpectedJson)

{
  WJTL_STATUS WVar1;
  int iVar2;
  JL_STATUS JVar3;
  bool Condition;
  char *jsonString;
  
  jsonString = (char *)0x0;
  WVar1 = JlStructToJsonEx(Structure,StructDescription,(ulong)StructDescriptionCount,0x2c,
                           &jsonString);
  Condition = WVar1 == WJTL_STATUS_SUCCESS;
  if (!Condition) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(Condition,
                   "((JL_STATUS)(JlStructToJsonEx(Structure, StructDescription,StructDescriptionCount, ( ((JL_OUTPUT_FLAGS) 0x4 ) | ((JL_OUTPUT_FLAGS) 0x8 ) | ((JL_OUTPUT_FLAGS) 0x20 ) ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"MakeJson5AndVerify",0x52);
  if (jsonString != (char *)0x0) {
    iVar2 = strcmp(jsonString,ExpectedJson);
    WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, ExpectedJson ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                     ,"MakeJson5AndVerify",0x55);
    JVar3 = JlFreeJsonStringBuffer(&jsonString);
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeJsonStringBuffer( &jsonString ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                     ,"MakeJson5AndVerify",0x56);
    if (JVar3 != JL_STATUS_SUCCESS || iVar2 != 0) {
      WVar1 = WJTL_STATUS_FAILED;
    }
  }
  return WVar1;
}

Assistant:

static
WJTL_STATUS
    MakeJson5AndVerify
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        uint32_t                    StructDescriptionCount,         // [in]
        char const*                 ExpectedJson                    // [in]
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    char* jsonString = NULL;
    JL_ASSERT_SUCCESS( JlStructToJsonEx(Structure, StructDescription,StructDescriptionCount, JL_OUTPUT_FLAGS_JSON5, &jsonString ) );
    if( NULL != jsonString )
    {
        JL_ASSERT( strcmp( jsonString, ExpectedJson ) == 0 );
        JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &jsonString ) );
    }

    return TestReturn;
}